

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall
DomConnectionHints::read(DomConnectionHints *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  DomConnectionHint *this_00;
  size_t __nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QStringView other;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_78;
  QArrayDataPointer<char16_t> local_60;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)CONCAT44(in_register_00000034,__fd));
      if (bVar1) goto LAB_00161dd4;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_48.m_size = -0x5555555555555556;
      local_48.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
      local_48 = (QStringView)QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s((QString *)&local_60,L"hint",4);
      __nbytes_00 = 0;
      other.m_data = local_60.ptr;
      other.m_size = local_60.size;
      iVar2 = QStringView::compare(&local_48,other,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      if (iVar2 == 0) {
        this_00 = (DomConnectionHint *)operator_new(0x28);
        (this_00->m_attr_type).d.d = (Data *)0x0;
        (this_00->m_attr_type).d.ptr = (char16_t *)0x0;
        (this_00->m_attr_type).d.size = 0;
        this_00->m_has_attr_type = false;
        *(undefined3 *)&this_00->field_0x19 = 0;
        this_00->m_children = 0;
        this_00->m_x = 0;
        this_00->m_y = 0;
        DomConnectionHint::read(this_00,__fd,__buf_00,__nbytes_00);
        QList<DomConnectionHint_*>::append(&this->m_hint,this_00);
      }
      else {
        local_78.a.m_size = 0x13;
        local_78.a.m_data = "Unexpected element ";
        local_78.b = &local_48;
        QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                  ((QString *)&local_60,&local_78);
        QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      }
    }
  } while (iVar2 != 5);
LAB_00161dd4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomConnectionHints::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"hint"_s, Qt::CaseInsensitive)) {
                auto *v = new DomConnectionHint();
                v->read(reader);
                m_hint.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}